

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_file.c
# Opt level: O2

guint16 * swap_read_pgm(char *name,size_t *w,size_t *h)

{
  ushort *puVar1;
  int iVar2;
  FILE *__stream;
  guint16 *__ptr;
  size_t sVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  int severity;
  char *fmt;
  int maxval;
  int height;
  int width;
  size_t *local_38;
  
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    piVar5 = __errno_location();
    g_strerror(*piVar5);
    fmt = "%s: %s";
    iVar2 = 0x181;
    severity = 0x1068;
  }
  else {
    iVar2 = fgetc(__stream);
    if (iVar2 == 0x50) {
      iVar2 = fgetc(__stream);
      if (iVar2 == 0x35) {
        blank((FILE *)__stream,name);
        iVar2 = __isoc99_fscanf(__stream,"%d",&width);
        if (iVar2 == 1) {
          blank((FILE *)__stream,name);
          iVar2 = __isoc99_fscanf(__stream,"%d",&height);
          if (iVar2 == 1) {
            blank((FILE *)__stream,name);
            iVar2 = __isoc99_fscanf(__stream,"%d",&maxval);
            if (iVar2 == 1) {
              local_38 = w;
              blank((FILE *)__stream,name);
              if ((((width < 0x8000) && (0 < width)) && (0 < height)) &&
                 (((0 < maxval && (height < 0x8000)) && (maxval < 0x10000)))) {
                uVar7 = height * width;
                __ptr = (guint16 *)g_malloc(uVar7 * 2);
                sVar3 = fread(__ptr,(ulong)(uVar7 << (0xff < maxval)),1,__stream);
                if (sVar3 != 1) {
                  _p2sc_msg("swap_read_pgm",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
                            ,0x1a3,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0xce4,
                            "fread(%s): failed",name);
                }
                fclose(__stream);
                uVar4 = (ulong)uVar7;
                if (maxval < 0x100) {
                  for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
                    __ptr[uVar4 - 1] = (ushort)*(byte *)((long)__ptr + (uVar4 - 1));
                  }
                }
                else {
                  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
                    puVar1 = __ptr + uVar6;
                    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                  }
                }
                *local_38 = (long)width;
                *h = (long)height;
                return __ptr;
              }
              _p2sc_msg("swap_read_pgm",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
                        ,0x198,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
                        "%s: invalid image - width = %d, height = %d, maxval = %d",name,
                        (ulong)(uint)width,(ulong)(uint)height,(ulong)(uint)maxval);
              goto LAB_0010ce87;
            }
            fmt = "%s: failed read of maxval";
            iVar2 = 0x191;
          }
          else {
            fmt = "%s: failed read of height";
            iVar2 = 0x18e;
          }
        }
        else {
          fmt = "%s: failed read of width";
          iVar2 = 0x18b;
        }
        severity = 0x10cc;
        goto LAB_0010ce7f;
      }
      fmt = "%s: expected 5, got %d";
      iVar2 = 0x188;
    }
    else {
      fmt = "%s: expected P, got %d";
      iVar2 = 0x185;
    }
    severity = 0x10cc;
  }
LAB_0010ce7f:
  _p2sc_msg("swap_read_pgm",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
            ,iVar2,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",severity,fmt,name);
LAB_0010ce87:
  exit(1);
}

Assistant:

guint16 *swap_read_pgm(const char *name, size_t *w, size_t *h) {
    FILE *f;
    int c, i, len, isize, width, height, maxval;

    guint16 *ret = NULL;

    if (!(f = fopen(name, "rb")))
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: %s", name, g_strerror(errno));

    c = fgetc(f);
    if (c != 'P')
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: expected P, got %d", name, c);
    c = fgetc(f);
    if (c != '5')
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: expected 5, got %d", name, c);
    blank(f, name);
    if (fscanf(f, "%d", &width) != 1)
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: failed read of width", name);
    blank(f, name);
    if (fscanf(f, "%d", &height) != 1)
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: failed read of height", name);
    blank(f, name);
    if (fscanf(f, "%d", &maxval) != 1)
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: failed read of maxval", name);
    blank(f, name);

    if (width <= 0 || height <= 0 || maxval <= 0 ||
        width > 32767 || height > 32767 || maxval > 65535)
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA,
                 "%s: invalid image - width = %d, height = %d, maxval = %d",
                 name, width, height, maxval);

    len = width * height;
    ret = (guint16 *) g_malloc(len * sizeof *ret);

    if (maxval < 256)
        isize = 1;
    else
        isize = 2;

    if (fread(ret, len * isize, 1, f) != 1)
        P2SC_Msg(LVL_WARNING_CORRUPT_INPUT_DATA, "fread(%s): failed", name);
    fclose(f);

    if (isize == 2)
        for (i = 0; i < len; ++i)
            ret[i] = GUINT16_FROM_BE(ret[i]);
    else
        for (i = len - 1; i >= 0; --i)
            ret[i] = ((guint8 *) ret)[i];

    *w = width;
    *h = height;

    return ret;
}